

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChForce.cpp
# Opt level: O2

void __thiscall
chrono::ChForce::GetBodyForceTorque
          (ChForce *this,ChVector<double> *body_force,ChVector<double> *body_torque)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_80;
  undefined4 local_78;
  uint uStack_74;
  undefined4 uStack_70;
  uint uStack_6c;
  ulong local_68;
  undefined1 local_58 [56];
  undefined8 local_20;
  undefined8 local_18;
  
  if (this->mode == TORQUE) {
    if (body_force != (ChVector<double> *)&VNULL) {
      body_force->m_data[0] = VNULL;
      body_force->m_data[1] = DAT_011dd3e0;
      body_force->m_data[2] = DAT_011dd3e8;
    }
    if (&this->relforce != body_torque) {
      body_torque->m_data[0] = (this->relforce).m_data[0];
      body_torque->m_data[1] = (this->relforce).m_data[1];
      body_torque->m_data[2] = (this->relforce).m_data[2];
    }
  }
  else if (this->mode == FORCE) {
    if (&this->force != body_force) {
      body_force->m_data[0] = (this->force).m_data[0];
      body_force->m_data[1] = (this->force).m_data[1];
      body_force->m_data[2] = (this->force).m_data[2];
    }
    local_80.m_matrix = (non_const_type)local_58;
    local_58._0_8_ = 0;
    local_58._24_8_ = (this->vrelpoint).m_data[2];
    auVar3._0_8_ = -(double)local_58._24_8_;
    auVar3._8_4_ = 0;
    auVar3._12_4_ = 0x80000000;
    local_58._8_8_ = vmovlps_avx(auVar3);
    local_58._32_8_ = 0;
    auVar2 = *(undefined1 (*) [16])(this->vrelpoint).m_data;
    local_58._16_8_ = (this->vrelpoint).m_data[1];
    local_58._40_8_ = auVar2._0_8_ ^ 0x8000000000000000;
    local_58._48_4_ = auVar2._8_4_;
    local_58._52_4_ = auVar2._12_4_ ^ 0x80000000;
    local_20 = vmovlps_avx(auVar2);
    local_18 = 0;
    chrono::operator*(&local_80,&this->relforce);
    auVar2._0_8_ = local_68 ^ 0x8000000000000000;
    auVar2._8_4_ = 0;
    auVar2._12_4_ = 0x80000000;
    *(undefined4 *)body_torque->m_data = local_78;
    *(uint *)((long)body_torque->m_data + 4) = uStack_74 ^ 0x80000000;
    *(undefined4 *)(body_torque->m_data + 1) = uStack_70;
    *(uint *)((long)body_torque->m_data + 0xc) = uStack_6c ^ 0x80000000;
    dVar1 = (double)vmovlps_avx(auVar2);
    body_torque->m_data[2] = dVar1;
  }
  return;
}

Assistant:

void ChForce::GetBodyForceTorque(ChVector<>& body_force, ChVector<>& body_torque) const {
    switch (mode) {
        case FORCE: {
            body_force = force;  // Fb = F.w
            ChStarMatrix33<> Xpos(vrelpoint);
            body_torque = -(Xpos.transpose() * relforce);  // Mb = - [u]'[A]'F,w   = - [u]'F,l
            break;
        }
        case TORQUE:
            body_force = VNULL;      // Fb = 0;
            body_torque = relforce;  // Mb = [A]'F,w   = F,l
            break;

        default:
            break;
    }
}